

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cc
# Opt level: O1

string * __thiscall
google::protobuf::util::converter::DoubleAsString_abi_cxx11_
          (string *__return_storage_ptr__,converter *this,double value)

{
  char *pcVar1;
  char *pcVar2;
  
  if (value < INFINITY) {
    if (-INFINITY < value) {
      if (!NAN(value)) {
        SimpleDtoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)this,value);
        return __return_storage_ptr__;
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar2 = "NaN";
      pcVar1 = "";
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar2 = "-Infinity";
      pcVar1 = "";
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "Infinity";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string DoubleAsString(double value) {
  if (value == std::numeric_limits<double>::infinity()) return "Infinity";
  if (value == -std::numeric_limits<double>::infinity()) return "-Infinity";
  if (std::isnan(value)) return "NaN";

  return SimpleDtoa(value);
}